

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O1

Molecule * __thiscall
OpenMD::MoleculeCreator::createMolecule
          (MoleculeCreator *this,ForceField *ff,MoleculeStamp *molStamp,int globalIndex,
          LocalIndexManager *localIndexMan)

{
  double dVar1;
  Atom *sd;
  Atom *sd_00;
  LocalIndexManager *pLVar2;
  MoleculeStamp *pMVar3;
  int iVar4;
  Molecule *pMVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  _Var6;
  undefined4 extraout_var_06;
  pointer ppCVar7;
  ConstraintElem *this_00;
  ConstraintElem *this_01;
  ConstraintPair *cp;
  undefined1 uVar8;
  long lVar9;
  pointer ppAVar10;
  pointer ppCVar11;
  Atom **ppAVar12;
  long lVar13;
  CutoffGroup *pCVar14;
  ulong uVar15;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> freeAtoms;
  Atom *local_70;
  Atom **local_68;
  iterator iStack_60;
  Atom **local_58;
  LocalIndexManager *local_48;
  Molecule *local_40;
  MoleculeStamp *local_38;
  
  local_48 = localIndexMan;
  pMVar5 = (Molecule *)operator_new(400);
  Molecule::Molecule(pMVar5,globalIndex,molStamp);
  pLVar2 = local_48;
  lVar9 = (long)(molStamp->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_40 = pMVar5;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    lVar13 = 0;
    do {
      iVar4 = (*this->_vptr_MoleculeCreator[2])
                        (this,ff,*(undefined8 *)
                                  ((long)(molStamp->atomStamps_).
                                         super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                  (lVar13 >> 0x1d)));
      local_70 = (Atom *)CONCAT44(extraout_var,iVar4);
      Molecule::addAtom(local_40,local_70);
      lVar13 = lVar13 + 0x100000000;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  pMVar5 = local_40;
  lVar9 = (long)(molStamp->rigidBodyStamps_).
                super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->rigidBodyStamps_).
                super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    lVar13 = 0;
    do {
      iVar4 = (*this->_vptr_MoleculeCreator[3])
                        (this,molStamp,pMVar5,
                         *(undefined8 *)
                          ((long)(molStamp->rigidBodyStamps_).
                                 super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (lVar13 >> 0x1d)),
                         pLVar2);
      Molecule::addRigidBody(pMVar5,(RigidBody *)CONCAT44(extraout_var_00,iVar4));
      lVar13 = lVar13 + 0x100000000;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  lVar9 = (long)(molStamp->bondStamps_).
                super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->bondStamps_).
                super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    lVar13 = 0;
    do {
      iVar4 = (*this->_vptr_MoleculeCreator[4])
                        (this,ff,pMVar5,
                         *(undefined8 *)
                          ((long)(molStamp->bondStamps_).
                                 super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (lVar13 >> 0x1d)),
                         pLVar2);
      Molecule::addBond(pMVar5,(Bond *)CONCAT44(extraout_var_01,iVar4));
      lVar13 = lVar13 + 0x100000000;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  lVar9 = (long)(molStamp->bendStamps_).
                super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->bendStamps_).
                super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    lVar13 = 0;
    do {
      iVar4 = (*this->_vptr_MoleculeCreator[5])
                        (this,ff,pMVar5,
                         *(undefined8 *)
                          ((long)(molStamp->bendStamps_).
                                 super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (lVar13 >> 0x1d)),
                         pLVar2);
      Molecule::addBend(pMVar5,(Bend *)CONCAT44(extraout_var_02,iVar4));
      lVar13 = lVar13 + 0x100000000;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  lVar9 = (long)(molStamp->torsionStamps_).
                super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->torsionStamps_).
                super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    lVar13 = 0;
    do {
      iVar4 = (*this->_vptr_MoleculeCreator[6])
                        (this,ff,pMVar5,
                         *(undefined8 *)
                          ((long)(molStamp->torsionStamps_).
                                 super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (lVar13 >> 0x1d)),
                         pLVar2);
      Molecule::addTorsion(pMVar5,(Torsion *)CONCAT44(extraout_var_03,iVar4));
      lVar13 = lVar13 + 0x100000000;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  lVar9 = (long)(molStamp->inversionStamps_).
                super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->inversionStamps_).
                super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38 = molStamp;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    lVar13 = 0;
    do {
      iVar4 = (*this->_vptr_MoleculeCreator[7])
                        (this,ff,pMVar5,
                         *(undefined8 *)
                          ((long)(local_38->inversionStamps_).
                                 super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (lVar13 >> 0x1d)),
                         pLVar2);
      if ((Inversion *)CONCAT44(extraout_var_04,iVar4) != (Inversion *)0x0) {
        Molecule::addInversion(pMVar5,(Inversion *)CONCAT44(extraout_var_04,iVar4));
      }
      lVar13 = lVar13 + 0x100000000;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  pMVar3 = local_38;
  lVar9 = (long)(local_38->cutoffGroupStamps_).
                super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_38->cutoffGroupStamps_).
                super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    lVar13 = 0;
    do {
      iVar4 = (*this->_vptr_MoleculeCreator[8])
                        (this,pMVar5,
                         *(undefined8 *)
                          ((long)(pMVar3->cutoffGroupStamps_).
                                 super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (lVar13 >> 0x1d)),
                         pLVar2);
      Molecule::addCutoffGroup(pMVar5,(CutoffGroup *)CONCAT44(extraout_var_05,iVar4));
      lVar13 = lVar13 + 0x100000000;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  local_68 = (Atom **)0x0;
  iStack_60._M_current = (Atom **)0x0;
  local_58 = (Atom **)0x0;
  ppAVar10 = (pMVar5->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar10 ==
      (pMVar5->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_70 = (Atom *)0x0;
  }
  else {
    local_70 = *ppAVar10;
  }
  if (local_70 != (Atom *)0x0) {
    do {
      ppAVar10 = ppAVar10 + 1;
      if (iStack_60._M_current == local_58) {
        std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>::
        _M_realloc_insert<OpenMD::Atom*const&>
                  ((vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>> *)&local_68,iStack_60,
                   &local_70);
      }
      else {
        *iStack_60._M_current = local_70;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
      if (ppAVar10 ==
          (pMVar5->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_70 = (Atom *)0x0;
      }
      else {
        local_70 = *ppAVar10;
      }
    } while (local_70 != (Atom *)0x0);
  }
  ppCVar11 = (pMVar5->cutoffGroups_).
             super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar11 ==
      (pMVar5->cutoffGroups_).
      super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pCVar14 = (CutoffGroup *)0x0;
  }
  else {
    pCVar14 = *ppCVar11;
  }
  if (pCVar14 != (CutoffGroup *)0x0) {
    do {
      ppAVar10 = (pCVar14->cutoffAtomList).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppAVar10 ==
          (pCVar14->cutoffAtomList).
          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_70 = (Atom *)0x0;
      }
      else {
        local_70 = *ppAVar10;
      }
      while (local_70 != (Atom *)0x0) {
        ppAVar10 = ppAVar10 + 1;
        _Var6 = std::
                __remove_if<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Atom*const>>
                          (local_68,iStack_60._M_current,&local_70);
        if ((_Var6._M_current != iStack_60._M_current) && (iStack_60._M_current != _Var6._M_current)
           ) {
          iStack_60._M_current = _Var6._M_current;
        }
        if (ppAVar10 ==
            (pCVar14->cutoffAtomList).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_70 = (Atom *)0x0;
        }
        else {
          local_70 = *ppAVar10;
        }
      }
      ppCVar11 = ppCVar11 + 1;
      if (ppCVar11 ==
          (pMVar5->cutoffGroups_).
          super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pCVar14 = (CutoffGroup *)0x0;
      }
      else {
        pCVar14 = *ppCVar11;
      }
      local_70 = (Atom *)0x0;
    } while (pCVar14 != (CutoffGroup *)0x0);
  }
  pMVar3 = local_38;
  pLVar2 = local_48;
  ppAVar12 = local_68;
  if (local_68 != iStack_60._M_current) {
    do {
      iVar4 = (*this->_vptr_MoleculeCreator[9])(this,pMVar5,*ppAVar12,pLVar2);
      Molecule::addCutoffGroup(pMVar5,(CutoffGroup *)CONCAT44(extraout_var_06,iVar4));
      ppAVar12 = ppAVar12 + 1;
    } while (ppAVar12 != iStack_60._M_current);
  }
  (*this->_vptr_MoleculeCreator[10])(this,pMVar5);
  ppCVar7 = (pMVar3->constraintStamps_).
            super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pMVar3->constraintStamps_).
      super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppCVar7) {
    lVar9 = 0;
    uVar15 = 0;
    do {
      lVar13 = *(long *)((long)ppCVar7 + (lVar9 >> 0x1d));
      if (*(char *)(lVar13 + 0xca) == '\0') {
        uVar8 = *(undefined1 *)(lVar13 + 0xcb);
      }
      else {
        uVar8 = false;
      }
      if (*(char *)(lVar13 + 0x92) == '\x01') {
        memcpy(&painCave,
               "Constraint Error: A non-bond constraint was specified\n\twithout providing a value for the constrainedDistance.\n"
               ,0x6f);
        painCave.isFatal = 1;
        simError();
      }
      else {
        ppAVar10 = (local_40->atoms_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        sd = ppAVar10[*(uint *)(lVar13 + 0xd0)];
        sd_00 = ppAVar10[*(uint *)(lVar13 + 0xd4)];
        dVar1 = *(double *)(lVar13 + 0x98);
        this_00 = (ConstraintElem *)operator_new(0x28);
        ConstraintElem::ConstraintElem(this_00,&sd->super_StuntDouble);
        this_01 = (ConstraintElem *)operator_new(0x28);
        ConstraintElem::ConstraintElem(this_01,&sd_00->super_StuntDouble);
        cp = (ConstraintPair *)operator_new(0x28);
        cp->consElem1_ = this_00;
        cp->consElem2_ = this_01;
        cp->dist2 = dVar1 * dVar1;
        cp->force_ = 0.0;
        cp->printForce_ = (bool)uVar8;
        Molecule::addConstraintPair(local_40,cp);
      }
      uVar15 = uVar15 + 1;
      ppCVar7 = (local_38->constraintStamps_).
                super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x100000000;
    } while (uVar15 < (ulong)((long)(local_38->constraintStamps_).
                                    super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar7 >> 3)
            );
  }
  pMVar5 = local_40;
  (*this->_vptr_MoleculeCreator[0xb])(this,local_40);
  if ((local_38->ConstrainTotalCharge).super_ParameterBase.empty_ == false) {
    pMVar5->constrainTotalCharge_ =
         (bool)(local_38->ConstrainTotalCharge).super_ParameterBase.field_0x2b;
  }
  Molecule::complete(pMVar5);
  if (local_68 != (Atom **)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return pMVar5;
}

Assistant:

Molecule* MoleculeCreator::createMolecule(ForceField* ff,
                                            MoleculeStamp* molStamp,
                                            int globalIndex,
                                            LocalIndexManager* localIndexMan) {
    Molecule* mol = new Molecule(globalIndex, molStamp);

    // create atoms
    Atom* atom;
    AtomStamp* currentAtomStamp;
    size_t nAtom = molStamp->getNAtoms();
    for (size_t i = 0; i < nAtom; ++i) {
      currentAtomStamp = molStamp->getAtomStamp(i);
      atom             = createAtom(ff, currentAtomStamp, localIndexMan);
      mol->addAtom(atom);
    }

    // create rigidbodies
    RigidBody* rb;
    RigidBodyStamp* currentRigidBodyStamp;
    size_t nRigidbodies = molStamp->getNRigidBodies();

    for (size_t i = 0; i < nRigidbodies; ++i) {
      currentRigidBodyStamp = molStamp->getRigidBodyStamp(i);
      rb = createRigidBody(molStamp, mol, currentRigidBodyStamp, localIndexMan);
      mol->addRigidBody(rb);
    }

    // create bonds
    Bond* bond;
    BondStamp* currentBondStamp;
    size_t nBonds = molStamp->getNBonds();

    for (size_t i = 0; i < nBonds; ++i) {
      currentBondStamp = molStamp->getBondStamp(i);
      bond             = createBond(ff, mol, currentBondStamp, localIndexMan);
      mol->addBond(bond);
    }

    // create bends
    Bend* bend;
    BendStamp* currentBendStamp;
    size_t nBends = molStamp->getNBends();
    for (size_t i = 0; i < nBends; ++i) {
      currentBendStamp = molStamp->getBendStamp(i);
      bend             = createBend(ff, mol, currentBendStamp, localIndexMan);
      mol->addBend(bend);
    }

    // create torsions
    Torsion* torsion;
    TorsionStamp* currentTorsionStamp;
    size_t nTorsions = molStamp->getNTorsions();
    for (size_t i = 0; i < nTorsions; ++i) {
      currentTorsionStamp = molStamp->getTorsionStamp(i);
      torsion = createTorsion(ff, mol, currentTorsionStamp, localIndexMan);
      mol->addTorsion(torsion);
    }

    // create inversions
    Inversion* inversion;
    InversionStamp* currentInversionStamp;
    size_t nInversions = molStamp->getNInversions();
    for (size_t i = 0; i < nInversions; ++i) {
      currentInversionStamp = molStamp->getInversionStamp(i);
      inversion =
          createInversion(ff, mol, currentInversionStamp, localIndexMan);
      if (inversion != NULL) { mol->addInversion(inversion); }
    }

    // create cutoffGroups
    CutoffGroup* cutoffGroup;
    CutoffGroupStamp* currentCutoffGroupStamp;
    size_t nCutoffGroups = molStamp->getNCutoffGroups();
    for (size_t i = 0; i < nCutoffGroups; ++i) {
      currentCutoffGroupStamp = molStamp->getCutoffGroupStamp(i);
      cutoffGroup =
          createCutoffGroup(mol, currentCutoffGroupStamp, localIndexMan);
      mol->addCutoffGroup(cutoffGroup);
    }

    // every free atom is a cutoff group
    std::vector<Atom*> freeAtoms;
    std::vector<Atom*>::iterator ai;
    std::vector<Atom*>::iterator fai;

    // add all atoms into allAtoms set
    for (atom = mol->beginAtom(fai); atom != NULL; atom = mol->nextAtom(fai)) {
      freeAtoms.push_back(atom);
    }

    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    for (cg = mol->beginCutoffGroup(ci); cg != NULL;
         cg = mol->nextCutoffGroup(ci)) {
      for (atom = cg->beginAtom(ai); atom != NULL; atom = cg->nextAtom(ai)) {
        // erase the atoms belong to cutoff groups from freeAtoms vector
        freeAtoms.erase(std::remove(freeAtoms.begin(), freeAtoms.end(), atom),
                        freeAtoms.end());
      }
    }

    // loop over the free atoms and then create one cutoff group for
    // every single free atom

    for (fai = freeAtoms.begin(); fai != freeAtoms.end(); ++fai) {
      cutoffGroup = createCutoffGroup(mol, *fai, localIndexMan);
      mol->addCutoffGroup(cutoffGroup);
    }

    // create bonded constraintPairs:
    createConstraintPair(mol);

    // create non-bonded constraintPairs
    for (std::size_t i = 0; i < molStamp->getNConstraints(); ++i) {
      ConstraintStamp* cStamp = molStamp->getConstraintStamp(i);
      Atom* atomA;
      Atom* atomB;

      atomA = mol->getAtomAt(cStamp->getA());
      atomB = mol->getAtomAt(cStamp->getB());
      assert(atomA && atomB);

      bool printConstraintForce = false;

      if (cStamp->havePrintConstraintForce()) {
        printConstraintForce = cStamp->getPrintConstraintForce();
      }

      if (!cStamp->haveConstrainedDistance()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Constraint Error: A non-bond constraint was specified\n"
                 "\twithout providing a value for the constrainedDistance.\n");
        painCave.isFatal = 1;
        simError();
      } else {
        RealType distance         = cStamp->getConstrainedDistance();
        ConstraintElem* consElemA = new ConstraintElem(atomA);
        ConstraintElem* consElemB = new ConstraintElem(atomB);
        ConstraintPair* cPair     = new ConstraintPair(
            consElemA, consElemB, distance, printConstraintForce);
        mol->addConstraintPair(cPair);
      }
    }

    // now create the constraint elements:

    createConstraintElem(mol);

    // Does this molecule stamp define a total constrained charge value?
    // If so, let the created molecule know about it.
    if (molStamp->haveConstrainTotalCharge()) {
      mol->setConstrainTotalCharge(molStamp->getConstrainTotalCharge());
    }

    // The construction of this molecule is finished:
    mol->complete();

    return mol;
  }